

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::WBSetBit(LargeHeapBlock *this,char *addr)

{
  OutOfMemoryException *anon_var_0;
  AutoCriticalSection autoCs;
  AutoNestedHandledExceptionType local_20;
  uint local_1c;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint index;
  char *addr_local;
  LargeHeapBlock *this_local;
  
  __autoNestedHandledExceptionType.savedData.handledExceptionType = SUB84(addr,0);
  local_1c = (uint)((int)__autoNestedHandledExceptionType.savedData.handledExceptionType -
                   *(int *)&(this->super_HeapBlock).address) >> 3;
  ___autoNestedHandledExceptionType = addr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_20,ExceptionType_DisableCheck);
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&anon_var_0,&wbVerifyBitsLock);
  BVSparse<Memory::HeapAllocator>::Set(&this->wbVerifyBits,local_1c);
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&anon_var_0);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_20);
  return;
}

Assistant:

void LargeHeapBlock::WBSetBit(char* addr)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    try
    {
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(static_cast<ExceptionType>(ExceptionType_DisableCheck));
        AutoCriticalSection autoCs(&wbVerifyBitsLock);
        wbVerifyBits.Set(index);
    }
    catch (Js::OutOfMemoryException&)
    {
    }
}